

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

string * __thiscall
FactoredDecPOMDPDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,FactoredDecPOMDPDiscrete *this)

{
  pointer pSVar1;
  pointer ppRVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint_abi_cxx11_
            (&local_1e0,&this->super_MultiAgentDecisionProcessDiscreteFactoredStates);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  DecPOMDP::SoftPrint_abi_cxx11_
            (&local_1e0,
             (DecPOMDP *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"FactoredDecPOMDPDiscrete contains ",0x22);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," local reward functions.",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (this->_m_nrLRFs != 0) {
    uVar5 = 1;
    uVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"LRF ",4);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," statefactor scope ",0x13);
      pSVar1 = (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
      if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
LAB_0047f2e0:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      poVar3 = ::operator<<(poVar3,pSVar1 + uVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," agent scope ",0xd);
      pSVar1 = (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
      if (uVar4 < uVar6 || uVar4 - uVar6 == 0) goto LAB_0047f2e0;
      poVar3 = ::operator<<(poVar3,pSVar1 + uVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      ppRVar2 = (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_LRFs).
                        super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3) <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      (*(ppRVar2[uVar6]->super_RewardModelDiscreteInterface).super_QTableInterface.
        _vptr_QTableInterface[5])(&local_1e0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (this->_m_nrLRFs != uVar6);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1c0;
}

Assistant:

string FactoredDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint();
    ss << DecPOMDP::SoftPrint();
    ss << "FactoredDecPOMDPDiscrete contains " << _m_nrLRFs
       << " local reward functions." << endl;
    for(Index i=0;i!=_m_nrLRFs;++i)
    {
        ss << "LRF " << i << " statefactor scope " << _m_sfScopes.at(i)
           << " agent scope " << _m_agScopes.at(i) << endl;
        ss << _m_LRFs.at(i)->SoftPrint() << endl;
    }
    
    //print components specific to FactoredDecPOMDPDiscrete:
    return(ss.str());
}